

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

key_e __thiscall libchars::editor::decode_key(editor *this,uint8_t c)

{
  byte bVar1;
  char *__s;
  int iVar2;
  key_e kVar3;
  size_t sVar4;
  debug *this_00;
  ulong uVar5;
  long lVar6;
  size_t __n;
  double __x;
  byte local_148 [8];
  char buffer [256];
  
  __n = this->seq_N;
  if (__n < 0x10) {
    this->seq_N = __n + 1;
    this->seq[__n] = c;
    __n = this->seq_N;
    for (lVar6 = 8; lVar6 != 0x198; lVar6 = lVar6 + 0x10) {
      __s = *(char **)((long)&DW_ref___gxx_personality_v0 + lVar6);
      sVar4 = strlen(__s);
      iVar2 = bcmp(__s,this->seq,__n);
      if (iVar2 == 0) {
        if (sVar4 == __n) {
          this->seq_N = 0;
          kVar3 = *(key_e *)((long)&__decode_table + lVar6);
          if (this->obj->mode != MODE_MULTILINE) {
            return kVar3;
          }
          if (kVar3 != KEY_DEL) {
            return kVar3;
          }
          return KEY_EOF;
        }
        if (__n <= sVar4 && sVar4 != __n) {
          return PARTIAL_SEQ;
        }
      }
    }
    if ((__n < 2) && (iVar2 = isprint((uint)c), iVar2 != 0)) goto LAB_00114076;
  }
  memset(local_148,0,0x100);
  for (uVar5 = 0; uVar5 < __n; uVar5 = uVar5 + 1) {
    bVar1 = this->seq[uVar5];
    iVar2 = isprint((uint)bVar1);
    sVar4 = strlen((char *)local_148);
    if (iVar2 == 0) {
      sprintf((char *)(local_148 + sVar4),"\\x%02x",(ulong)bVar1);
      __n = this->seq_N;
    }
    else {
      local_148[sVar4] = bVar1;
      local_148[sVar4 + 1] = 0;
    }
  }
  this_00 = debug::initialize(0);
  debug::log(this_00,__x);
LAB_00114076:
  this->seq_N = 0;
  if ((c == '?') && (this->obj->mode == MODE_COMMAND)) {
    kVar3 = KEY_HELP;
  }
  else {
    iVar2 = isprint((uint)c);
    kVar3 = (uint)(iVar2 == 0) * 2 + PRINTABLE_CHAR;
  }
  return kVar3;
}

Assistant:

key_e editor::decode_key(uint8_t c)
    {
        if (seq_N < MAX_DECODE_SEQUENCE) {
            seq[seq_N++] = c;
            size_t idx;
            for (idx = 0; idx < DECODE_TABLE_ENTRIES; ++idx) {
                const char *T_seq = __decode_table[idx].sequence;
                size_t T_seq_N = strlen(T_seq);
                if (memcmp(T_seq, seq, seq_N) == 0) {
                    if (T_seq_N == seq_N) {
                        seq_N = 0;
                        if (obj->mode == MODE_MULTILINE && __decode_table[idx].result == KEY_DEL)
                            return KEY_EOF;
                        else
                            return __decode_table[idx].result;
                    }
                    else if (T_seq_N > seq_N) {
                        return PARTIAL_SEQ;
                    }
                }
            }
        }

        if (seq_N>1 || !isprint(c)) {
            size_t i;
            char buffer[256] = "";
            for (i=0; i<seq_N; ++i) {
                uint8_t cc = seq[i];
                if (isprint(cc))
                    sprintf(buffer+strlen(buffer), "%c", cc);
                else
                    sprintf(buffer+strlen(buffer), "\\x%02x", cc);
            }
            LC_LOG_DEBUG("UNKNOWN SEQUENCE: --> %s <--",buffer);
        }

        seq_N = 0;

        if (obj->mode == MODE_COMMAND && c == '?')
            return KEY_HELP;
        else if (isprint(c))
            return PRINTABLE_CHAR;
        else
            return IGNORE_SEQ;
    }